

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool __thiscall
picojson::input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
          (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,string *pattern)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  
  if (pattern->_M_string_length != 0) {
    pcVar2 = (pattern->_M_dataplus)._M_p;
    __stream_00 = (FILE *)pattern;
    do {
      iVar1 = getc(this,__stream_00);
      if (iVar1 != *pcVar2) {
        ungetc(this,(int)__stream_00,__stream);
        return false;
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != (pattern->_M_dataplus)._M_p + pattern->_M_string_length);
  }
  return true;
}

Assistant:

bool match(const std::string& pattern) {
      for (std::string::const_iterator pi(pattern.begin());
       pi != pattern.end();
       ++pi) {
    if (getc() != *pi) {
      ungetc();
      return false;
    }
      }
      return true;
    }